

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__s;
  string *psVar5;
  ostream *poVar6;
  cmState *this;
  uint uVar7;
  PolicyID id;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  string defaultVar;
  ostringstream e;
  PolicyStatus local_218;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  cmMakefile *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  uVar8 = minorVer + 1;
  uVar7 = patchVer + 1;
  bVar12 = patchVer == 0xffffffff;
  bVar10 = uVar8 < 9;
  bVar13 = minorVer == 8;
  bVar11 = uVar8 < 7;
  bVar14 = minorVer == 6;
  bVar9 = bVar13 && bVar12 || bVar10;
  id = CMP0000;
  local_1d0 = mf;
  do {
    switch(id) {
    case CMP0000:
    case CMP0001:
    case CMP0002:
    case CMP0003:
    case CMP0004:
    case CMP0005:
    case CMP0006:
    case CMP0007:
      uVar1 = (!bVar14 || !bVar12) && !bVar11;
      goto joined_r0x001d4d5d;
    case CMP0008:
      bVar2 = uVar7 < 2;
      goto joined_r0x001d4e1a;
    case CMP0009:
      bVar2 = uVar7 < 3;
joined_r0x001d4e1a:
      uVar1 = (!bVar2 || !bVar14) && !bVar11;
joined_r0x001d4d5d:
      if (((bool)uVar1 || majorVer != 2) && 1 < majorVer) goto switchD_001d4a18_default;
      goto LAB_001d4a23;
    case CMP0010:
    case CMP0011:
      bVar2 = uVar7 < 4 && bVar14 || bVar11;
      goto joined_r0x001d4d50;
    case CMP0012:
    case CMP0013:
    case CMP0014:
      bVar2 = bVar9;
joined_r0x001d4d50:
      uVar1 = !bVar2;
      goto joined_r0x001d4d5d;
    case CMP0015:
      bVar2 = uVar7 < 2;
      goto joined_r0x001d4dfa;
    case CMP0016:
      bVar2 = uVar7 < 4;
joined_r0x001d4dfa:
      uVar1 = (!bVar13 || !bVar2) && !bVar10;
      goto joined_r0x001d4d5d;
    case CMP0017:
      bVar2 = uVar7 < 5;
      goto joined_r0x001d4e5a;
    case CMP0018:
      bVar2 = uVar7 < 10;
joined_r0x001d4e5a:
      uVar1 = (!bVar2 || !bVar13) && !bVar10;
      goto joined_r0x001d4d5d;
    case CMP0019:
    case CMP0020:
      bVar2 = uVar7 < 0xc;
      goto joined_r0x001d4d5d;
    case CMP0021:
    case CMP0022:
    case CMP0023:
      bVar2 = uVar7 < 0xd;
joined_r0x001d4d5d:
      uVar1 = (!bVar2 || !bVar13) && !bVar10;
      goto joined_r0x001d4d5d;
    case CMP0024:
    case CMP0025:
    case CMP0026:
    case CMP0027:
    case CMP0028:
    case CMP0029:
    case CMP0030:
    case CMP0031:
    case CMP0032:
    case CMP0033:
    case CMP0034:
    case CMP0035:
    case CMP0036:
    case CMP0037:
    case CMP0038:
    case CMP0039:
    case CMP0040:
    case CMP0041:
    case CMP0042:
    case CMP0043:
    case CMP0044:
    case CMP0045:
    case CMP0046:
    case CMP0047:
    case CMP0048:
    case CMP0049:
    case CMP0050:
      bVar2 = minorVer == 0 && bVar12 || minorVer == 0xffffffff;
      break;
    case CMP0051:
    case CMP0052:
    case CMP0053:
    case CMP0054:
      bVar2 = minorVer == 1 && bVar12 || uVar8 < 2;
      break;
    case CMP0055:
    case CMP0056:
      bVar2 = minorVer == 2 && bVar12 || uVar8 < 3;
      break;
    case CMP0057:
    case CMP0058:
    case CMP0059:
    case CMP0060:
    case CMP0061:
    case CMP0062:
    case CMP0063:
      bVar2 = minorVer == 3 && bVar12 || uVar8 < 4;
      break;
    case CMP0064:
    case CMP0065:
      bVar2 = minorVer == 4 && bVar12 || uVar8 < 5;
      break;
    case CMP0066:
      bVar2 = minorVer == 7 && bVar12 || uVar8 < 8;
      break;
    case CMP0067:
      bVar2 = bVar9;
      break;
    case CMP0068:
    case CMP0069:
      bVar2 = minorVer == 9 && bVar12 || uVar8 < 10;
      break;
    case CMP0070:
    case CMP0071:
      bVar2 = minorVer == 10 && bVar12 || uVar8 < 0xb;
      break;
    case CMP0072:
      bVar2 = minorVer == 0xb && bVar12 || uVar8 < 0xc;
      break;
    case CMP0073:
    case CMP0074:
    case CMP0075:
      bVar2 = minorVer == 0xc && bVar12 || uVar8 < 0xd;
      break;
    case CMP0076:
    case CMP0077:
    case CMP0078:
    case CMP0079:
    case CMP0080:
    case CMP0081:
      bVar2 = minorVer == 0xd && bVar12 || uVar8 < 0xe;
      break;
    case CMP0082:
    case CMP0083:
    case CMP0084:
    case CMP0085:
    case CMP0086:
    case CMP0087:
    case CMP0088:
      bVar2 = minorVer == 0xe && bVar12 || uVar8 < 0xf;
      break;
    case CMP0089:
    case CMP0090:
      bVar2 = minorVer == 0xf && bVar12 || uVar8 < 0x10;
      break;
    default:
      goto switchD_001d4a18_default;
    }
    if (bVar2 && majorVer == 3 || majorVer < 3) {
LAB_001d4a23:
      __s = idToString(id);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,__s,&local_211);
      std::operator+(&local_1f0,"CMAKE_POLICY_DEFAULT_",&local_210);
      psVar5 = cmMakefile::GetSafeDefinition(mf,&local_1f0);
      iVar3 = std::__cxx11::string::compare((char *)psVar5);
      bVar2 = true;
      if (iVar3 == 0) {
        local_218 = NEW;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)psVar5);
        if (iVar4 == 0) {
          local_218 = OLD;
        }
        else {
          local_218 = WARN;
          if (psVar5->_M_string_length != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                                local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," has value \"",0xc);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).",0x2a);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar2 = false;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        return false;
      }
      bVar2 = cmMakefile::SetPolicy(mf,id,local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        return false;
      }
      if (id == CMP0001 && iVar3 != 0) {
        this = cmMakefile::GetState(mf);
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
        psVar5 = cmState::GetInitializedCacheValue(this,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
        if (psVar5 == (string *)0x0) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
          cmMakefile::AddCacheDefinition
                    (mf,(string *)local_1a8,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
          }
        }
      }
    }
    else {
switchD_001d4a18_default:
      bVar2 = cmMakefile::SetPolicy(mf,id,NEW);
      if (!bVar2) {
        return false;
      }
    }
    id = id + CMP0001;
    if (id == CMPCOUNT) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer)
{
  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = PolicyID(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  return true;
}